

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O1

EFBMatchResult __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::breakExceptionAt
          (SimpleFilteredSentenceBreakIterator *this,int32_t n)

{
  char16_t cVar1;
  UCharsTrie *pUVar2;
  char16_t *pcVar3;
  UChar32 UVar4;
  UStringTrieResult UVar5;
  EFBMatchResult EVar6;
  int64_t index;
  uint uVar7;
  bool bVar8;
  
  utext_setNativeIndex_63((this->fText).super_LocalPointerBase<UText>.ptr,(long)n);
  pUVar2 = (this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>.ptr;
  pUVar2->pos_ = pUVar2->uchars_;
  pUVar2->remainingMatchLength_ = -1;
  UVar4 = utext_previous32_63((this->fText).super_LocalPointerBase<UText>.ptr);
  if (UVar4 != 0x20) {
    utext_next32_63((this->fText).super_LocalPointerBase<UText>.ptr);
  }
  UVar4 = utext_previous32_63((this->fText).super_LocalPointerBase<UText>.ptr);
  if (UVar4 == -1) {
    uVar7 = 0xffffffff;
    index = -1;
    bVar8 = false;
  }
  else {
    index = -1;
    uVar7 = 0xffffffff;
    do {
      UVar5 = UCharsTrie::nextForCodePoint
                        ((this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>.
                         ptr,UVar4);
      if ((UVar5 & USTRINGTRIE_NO_VALUE) == USTRINGTRIE_NO_MATCH) break;
      if (1 < (int)UVar5) {
        index = utext_getNativeIndex_63((this->fText).super_LocalPointerBase<UText>.ptr);
        pcVar3 = ((this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>.ptr)->
                 pos_;
        cVar1 = *pcVar3;
        if (cVar1 < L'\0') {
          uVar7 = (ushort)cVar1 & 0x7fff;
          if (0x3fff < uVar7) {
            if (uVar7 == 0x7fff) goto LAB_002927ba;
            uVar7 = uVar7 * 0x10000 + (uint)(ushort)pcVar3[1] + 0xc0000000;
          }
        }
        else if ((ushort)cVar1 < 0x4040) {
          uVar7 = ((ushort)cVar1 >> 6) - 1;
        }
        else if ((ushort)cVar1 < 0x7fc0) {
          uVar7 = ((ushort)cVar1 & 0x7fc0) * 0x400 + (uint)(ushort)pcVar3[1] + 0xfeff0000;
        }
        else {
LAB_002927ba:
          uVar7 = CONCAT22(pcVar3[1],pcVar3[2]);
        }
      }
      UVar4 = utext_previous32_63((this->fText).super_LocalPointerBase<UText>.ptr);
    } while (UVar4 != -1);
    bVar8 = UVar5 == USTRINGTRIE_NO_MATCH;
  }
  if (bVar8) goto LAB_00292896;
  pcVar3 = ((this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>.ptr)->pos_;
  cVar1 = *pcVar3;
  if (cVar1 < L'\0') {
    uVar7 = (ushort)cVar1 & 0x7fff;
    if (0x3fff < uVar7) {
      if (uVar7 == 0x7fff) goto LAB_00292878;
      uVar7 = uVar7 * 0x10000 + (uint)(ushort)pcVar3[1] + 0xc0000000;
    }
  }
  else if ((ushort)cVar1 < 0x4040) {
    uVar7 = ((ushort)cVar1 >> 6) - 1;
  }
  else if ((ushort)cVar1 < 0x7fc0) {
    uVar7 = ((ushort)cVar1 & 0x7fc0) * 0x400 + (uint)(ushort)pcVar3[1] + 0xfeff0000;
  }
  else {
LAB_00292878:
    uVar7 = CONCAT22(pcVar3[1],pcVar3[2]);
  }
  index = utext_getNativeIndex_63((this->fText).super_LocalPointerBase<UText>.ptr);
LAB_00292896:
  EVar6 = kNoExceptionHere;
  if ((-1 < index) && (EVar6 = kExceptionHere, uVar7 != 2)) {
    if ((uVar7 == 1) &&
       (pUVar2 = (this->fData->fForwardsPartialTrie).super_LocalPointerBase<icu_63::UCharsTrie>.ptr,
       pUVar2 != (UCharsTrie *)0x0)) {
      pUVar2->pos_ = pUVar2->uchars_;
      pUVar2->remainingMatchLength_ = -1;
      utext_setNativeIndex_63((this->fText).super_LocalPointerBase<UText>.ptr,index);
      UVar4 = utext_next32_63((this->fText).super_LocalPointerBase<UText>.ptr);
      if (UVar4 != -1) {
        do {
          UVar5 = UCharsTrie::nextForCodePoint
                            ((this->fData->fForwardsPartialTrie).
                             super_LocalPointerBase<icu_63::UCharsTrie>.ptr,UVar4);
          if ((UVar5 & USTRINGTRIE_NO_VALUE) == USTRINGTRIE_NO_MATCH) break;
          UVar4 = utext_next32_63((this->fText).super_LocalPointerBase<UText>.ptr);
        } while (UVar4 != -1);
        EVar6 = (EFBMatchResult)(UVar5 != USTRINGTRIE_NO_MATCH);
      }
    }
    else {
      EVar6 = kNoExceptionHere;
    }
  }
  return EVar6;
}

Assistant:

SimpleFilteredSentenceBreakIterator::EFBMatchResult
SimpleFilteredSentenceBreakIterator::breakExceptionAt(int32_t n) {
    int64_t bestPosn = -1;
    int32_t bestValue = -1;
    // loops while 'n' points to an exception.
    utext_setNativeIndex(fText.getAlias(), n); // from n..
    fData->fBackwardsTrie->reset();
    UChar32 uch;

    //if(debug2) u_printf(" n@ %d\n", n);
    // Assume a space is following the '.'  (so we handle the case:  "Mr. /Brown")
    if((uch=utext_previous32(fText.getAlias()))==(UChar32)0x0020) {  // TODO: skip a class of chars here??
      // TODO only do this the 1st time?
      //if(debug2) u_printf("skipping prev: |%C| \n", (UChar)uch);
    } else {
      //if(debug2) u_printf("not skipping prev: |%C| \n", (UChar)uch);
      uch = utext_next32(fText.getAlias());
      //if(debug2) u_printf(" -> : |%C| \n", (UChar)uch);
    }

    UStringTrieResult r = USTRINGTRIE_INTERMEDIATE_VALUE;

    while((uch=utext_previous32(fText.getAlias()))!=U_SENTINEL  &&   // more to consume backwards and..
          USTRINGTRIE_HAS_NEXT(r=fData->fBackwardsTrie->nextForCodePoint(uch))) {// more in the trie
      if(USTRINGTRIE_HAS_VALUE(r)) { // remember the best match so far
        bestPosn = utext_getNativeIndex(fText.getAlias());
        bestValue = fData->fBackwardsTrie->getValue();
      }
      //if(debug2) u_printf("rev< /%C/ cont?%d @%d\n", (UChar)uch, r, utext_getNativeIndex(fText.getAlias()));
    }

    if(USTRINGTRIE_MATCHES(r)) { // exact match?
      //if(debug2) u_printf("rev<?/%C/?end of seq.. r=%d, bestPosn=%d, bestValue=%d\n", (UChar)uch, r, bestPosn, bestValue);
      bestValue = fData->fBackwardsTrie->getValue();
      bestPosn = utext_getNativeIndex(fText.getAlias());
      //if(debug2) u_printf("rev<+/%C/+end of seq.. r=%d, bestPosn=%d, bestValue=%d\n", (UChar)uch, r, bestPosn, bestValue);
    }

    if(bestPosn>=0) {
      //if(debug2) u_printf("rev< /%C/ end of seq.. r=%d, bestPosn=%d, bestValue=%d\n", (UChar)uch, r, bestPosn, bestValue);

      //if(USTRINGTRIE_MATCHES(r)) {  // matched - so, now what?
      //int32_t bestValue = fBackwardsTrie->getValue();
      ////if(debug2) u_printf("rev< /%C/ matched, skip..%d  bestValue=%d\n", (UChar)uch, r, bestValue);

      if(bestValue == kMATCH) { // exact match!
        //if(debug2) u_printf(" exact backward match\n");
        return kExceptionHere; // See if the next is another exception.
      } else if(bestValue == kPARTIAL
                && fData->fForwardsPartialTrie.isValid()) { // make sure there's a forward trie
        //if(debug2) u_printf(" partial backward match\n");
        // We matched the "Ph." in "Ph.D." - now we need to run everything through the forwards trie
        // to see if it matches something going forward.
        fData->fForwardsPartialTrie->reset();
        UStringTrieResult rfwd = USTRINGTRIE_INTERMEDIATE_VALUE;
        utext_setNativeIndex(fText.getAlias(), bestPosn); // hope that's close ..
        //if(debug2) u_printf("Retrying at %d\n", bestPosn);
        while((uch=utext_next32(fText.getAlias()))!=U_SENTINEL &&
              USTRINGTRIE_HAS_NEXT(rfwd=fData->fForwardsPartialTrie->nextForCodePoint(uch))) {
          //if(debug2) u_printf("fwd> /%C/ cont?%d @%d\n", (UChar)uch, rfwd, utext_getNativeIndex(fText.getAlias()));
        }
        if(USTRINGTRIE_MATCHES(rfwd)) {
          //if(debug2) u_printf("fwd> /%C/ == forward match!\n", (UChar)uch);
          // only full matches here, nothing to check
          // skip the next:
            return kExceptionHere;
        } else {
          //if(debug2) u_printf("fwd> /%C/ no match.\n", (UChar)uch);
          // no match (no exception) -return the 'underlying' break
          return kNoExceptionHere;
        }
      } else {
        return kNoExceptionHere; // internal error and/or no forwards trie
      }
    } else {
      //if(debug2) u_printf("rev< /%C/ .. no match..%d\n", (UChar)uch, r);  // no best match
      return kNoExceptionHere; // No match - so exit. Not an exception.
    }
}